

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_escape_sequence<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  value_type *pvVar2;
  long lVar3;
  ulong uVar4;
  error_info *v;
  error_info *v_00;
  error_info *v_01;
  string sVar5;
  byte bVar6;
  ulong uVar7;
  EVP_PKEY_CTX *ctx_00;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  EVP_PKEY_CTX *this;
  bool bVar12;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  utf8;
  string_type retval;
  sequence scanner;
  region reg;
  string escape_seqs;
  undefined1 local_740 [8];
  undefined1 auStack_738 [8];
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
  avStack_730 [2];
  undefined8 local_700;
  undefined8 local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  pointer local_6e0;
  pointer pbStack_6d8;
  pointer local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  sequence local_6a8;
  undefined1 local_688 [104];
  undefined1 local_620 [104];
  _func_int **local_5b8;
  undefined8 local_5b0;
  _func_int *p_Stack_5a8;
  undefined8 uStack_5a0;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  _func_int **local_498;
  _Alloc_hider _Stack_490;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  _Alloc_hider local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  pointer local_438;
  pointer pbStack_430;
  pointer local_428;
  _func_int **local_418;
  _Alloc_hider _Stack_410;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  pointer local_3b8;
  pointer pbStack_3b0;
  pointer local_3a8;
  _func_int **local_398;
  _Alloc_hider _Stack_390;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  pointer local_338;
  pointer pbStack_330;
  pointer local_328;
  _func_int **local_318;
  _Alloc_hider _Stack_310;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  pointer local_2b8;
  pointer pbStack_2b0;
  pointer local_2a8;
  failure<toml::error_info> local_298;
  failure<toml::error_info> local_240;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar10 = loc->location_;
  lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar7 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar3;
  if (uVar7 <= uVar10 + 1) {
    if (uVar7 == uVar10) goto LAB_0037196e;
    sVar8 = loc->line_number_;
    sVar9 = loc->column_number_;
    do {
      if (*(char *)(lVar3 + uVar10) == '\n') {
        sVar8 = sVar8 + 1;
        loc->line_number_ = sVar8;
        sVar9 = 1;
      }
      else {
        sVar9 = sVar9 + 1;
      }
      loc->column_number_ = sVar9;
      uVar10 = uVar10 + 1;
    } while (uVar7 != uVar10);
    loc->location_ = uVar7;
LAB_00371a79:
    bVar12 = false;
LAB_00371a7f:
    if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_x == false) {
      if (bVar12) {
        bVar6 = *(byte *)(lVar3 + uVar7);
LAB_00371bb9:
        local_6c8.field_2._M_local_buf[0] = '\0';
        local_6c8._M_string_length = 0;
        local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
        if (bVar6 == 0x55) {
          local_620._0_8_ = &PTR__scanner_base_004df8e0;
          local_620[8] = 'U';
          syntax::hexdig::hexdig((hexdig *)local_740,&ctx->toml_spec_);
          local_688._0_8_ = &PTR__repeat_exact_004dfb00;
          local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
          scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
                    ((scanner_storage *)(local_688 + 0x10),(hexdig *)local_740);
          sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                    (&local_6a8,(character *)local_620,(repeat_exact *)local_688);
          if ((tuple<toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              )local_688._16_8_ != (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
            (*(*(_func_int ***)local_688._16_8_)[1])();
          }
          local_688._16_8_ =
               (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                )0x0;
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(auStack_738 + 8));
          sequence::scan((region *)local_688,&local_6a8,loc);
          if ((_func_int **)local_688._0_8_ == (_func_int **)0x0) {
            region::region((region *)local_620,loc);
            source_location::source_location((source_location *)local_740,(region *)local_620);
            region::~region((region *)local_620);
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_538,
                       "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\Uhhhhhhhh"
                       ,"");
            local_3d8._M_p = (pointer)&local_3c8;
            local_3e8 = avStack_730[1].
                        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_;
            uStack_3e4 = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
            uStack_3e0 = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
            uStack_3dc = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            local_3f8 = avStack_730[0].
                        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
            uStack_3f4 = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            uStack_3f0 = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_;
            uStack_3ec = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_;
            local_408 = avStack_730[0].
                        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_;
            uStack_404 = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_;
            uStack_400 = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
            uStack_3fc = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
            local_418 = (_func_int **)local_740;
            _Stack_410._M_p = (pointer)auStack_738;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_700 == &local_6f0) {
              local_3c8._8_8_ = local_6f0._8_8_;
            }
            else {
              local_3d8._M_p = (pointer)local_700;
            }
            local_3d0 = local_6f8;
            local_6f8 = 0;
            local_6f0._M_local_buf[0] = '\0';
            local_3b8 = local_6e0;
            pbStack_3b0 = pbStack_6d8;
            local_3a8 = local_6d0;
            local_6e0 = (pointer)0x0;
            pbStack_6d8 = (pointer)0x0;
            local_6d0 = (pointer)0x0;
            local_700 = &local_6f0;
            local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"here","");
            make_error_info<>((error_info *)local_620,&local_538,(source_location *)&local_418,
                              &local_558);
            err<toml::error_info>(&local_138,(error_info *)local_620);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_138);
            failure<toml::error_info>::~failure(&local_138);
            error_info::~error_info((error_info *)local_620);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)&local_418);
            local_4b8.field_2._M_allocated_capacity = local_538.field_2._M_allocated_capacity;
            _Var11._M_p = local_538._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
LAB_00372893:
              operator_delete(_Var11._M_p,local_4b8.field_2._M_allocated_capacity + 1);
            }
LAB_0037289b:
            source_location::~source_location((source_location *)local_740);
            region::~region((region *)local_688);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector(&local_6a8.others_);
            goto LAB_003729ba;
          }
          parse_utf8_codepoint<toml::type_config>
                    ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      *)local_740,(region *)local_688);
          sVar5 = local_740[0];
          if (local_740[0] == (string)0x0) {
            err<toml::error_info_const&>(&local_298,(toml *)auStack_738,v_01);
            __return_storage_ptr__->is_ok_ = false;
            this = (EVP_PKEY_CTX *)&local_298;
LAB_003724ef:
            ctx_00 = this;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       (failure<toml::error_info> *)this);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)this);
          }
          else {
            pvVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                               *)local_740,(source_location)0x4e0058);
            ctx_00 = (EVP_PKEY_CTX *)(pvVar2->_M_dataplus)._M_p;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_6c8,(char *)ctx_00,pvVar2->_M_string_length);
          }
        }
        else {
          if (bVar6 != 0x75) goto LAB_00371cd8;
          local_620._0_8_ = &PTR__scanner_base_004df8e0;
          local_620[8] = 'u';
          syntax::hexdig::hexdig((hexdig *)local_740,&ctx->toml_spec_);
          local_688._0_8_ = &PTR__repeat_exact_004dfb00;
          local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
          scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
                    ((scanner_storage *)(local_688 + 0x10),(hexdig *)local_740);
          sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                    (&local_6a8,(character *)local_620,(repeat_exact *)local_688);
          if ((tuple<toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              )local_688._16_8_ != (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
            (*(*(_func_int ***)local_688._16_8_)[1])();
          }
          local_688._16_8_ =
               (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                )0x0;
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(auStack_738 + 8));
          sequence::scan((region *)local_688,&local_6a8,loc);
          if ((_func_int **)local_688._0_8_ == (_func_int **)0x0) {
            region::region((region *)local_620,loc);
            source_location::source_location((source_location *)local_740,(region *)local_620);
            region::~region((region *)local_620);
            local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4f8,
                       "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\uhhhh"
                       ,"");
            local_358._M_p = (pointer)&local_348;
            local_368 = avStack_730[1].
                        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_;
            uStack_364 = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
            uStack_360 = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
            uStack_35c = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            local_378 = avStack_730[0].
                        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
            uStack_374 = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            uStack_370 = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_;
            uStack_36c = avStack_730[1].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_;
            local_388 = avStack_730[0].
                        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_;
            uStack_384 = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_;
            uStack_380 = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
            uStack_37c = avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
            local_398 = (_func_int **)local_740;
            _Stack_390._M_p = (pointer)auStack_738;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_700 == &local_6f0) {
              local_348._8_8_ = local_6f0._8_8_;
            }
            else {
              local_358._M_p = (pointer)local_700;
            }
            local_350 = local_6f8;
            local_6f8 = 0;
            local_6f0._M_local_buf[0] = '\0';
            local_338 = local_6e0;
            pbStack_330 = pbStack_6d8;
            local_328 = local_6d0;
            local_6e0 = (pointer)0x0;
            pbStack_6d8 = (pointer)0x0;
            local_6d0 = (pointer)0x0;
            local_700 = &local_6f0;
            local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"here","");
            make_error_info<>((error_info *)local_620,&local_4f8,(source_location *)&local_398,
                              &local_518);
            err<toml::error_info>(&local_e0,(error_info *)local_620);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_e0);
            failure<toml::error_info>::~failure(&local_e0);
            error_info::~error_info((error_info *)local_620);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2) {
              operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)&local_398);
            local_4b8.field_2._M_allocated_capacity = local_4f8.field_2._M_allocated_capacity;
            _Var11._M_p = local_4f8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) goto LAB_00372893;
            goto LAB_0037289b;
          }
          parse_utf8_codepoint<toml::type_config>
                    ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      *)local_740,(region *)local_688);
          sVar5 = local_740[0];
          if (local_740[0] == (string)0x0) {
            err<toml::error_info_const&>(&local_240,(toml *)auStack_738,v_00);
            __return_storage_ptr__->is_ok_ = false;
            this = (EVP_PKEY_CTX *)&local_240;
            goto LAB_003724ef;
          }
          pvVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                   ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                             *)local_740,(source_location)0x4e0040);
          ctx_00 = (EVP_PKEY_CTX *)(pvVar2->_M_dataplus)._M_p;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(&local_6c8,(char *)ctx_00,pvVar2->_M_string_length);
        }
LAB_003724ff:
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                   *)local_740,ctx_00);
        region::~region((region *)local_688);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_6a8.others_);
        if (sVar5 == (string)0x0) goto LAB_003729ba;
        goto LAB_00372909;
      }
    }
    else if (bVar12) {
      bVar6 = *(byte *)(lVar3 + uVar7);
LAB_00371a9a:
      local_6c8.field_2._M_local_buf[0] = '\0';
      local_6c8._M_string_length = 0;
      local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
      if (bVar6 != 0x78) goto LAB_00371bb9;
      local_620._0_8_ = &PTR__scanner_base_004df8e0;
      local_620[8] = 'x';
      syntax::hexdig::hexdig((hexdig *)local_740,&ctx->toml_spec_);
      local_688._0_8_ = &PTR__repeat_exact_004dfb00;
      local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
      scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
                ((scanner_storage *)(local_688 + 0x10),(hexdig *)local_740);
      sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                (&local_6a8,(character *)local_620,(repeat_exact *)local_688);
      if ((tuple<toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>)
          local_688._16_8_ != (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
        (*(*(_func_int ***)local_688._16_8_)[1])();
      }
      local_688._16_8_ =
           (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
            )0x0;
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(auStack_738 + 8));
      sequence::scan((region *)local_688,&local_6a8,loc);
      if ((_func_int **)local_688._0_8_ == (_func_int **)0x0) {
        region::region((region *)local_620,loc);
        source_location::source_location((source_location *)local_740,(region *)local_620);
        region::~region((region *)local_620);
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4b8,
                   "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\xhh","");
        local_2d8._M_p = (pointer)&local_2c8;
        local_2e8 = avStack_730[1].
                    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        uStack_2e4 = avStack_730[1].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_finish._4_4_;
        uStack_2e0 = avStack_730[1].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        uStack_2dc = avStack_730[1].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        local_2f8 = avStack_730[0].
                    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        uStack_2f4 = avStack_730[0].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        uStack_2f0 = avStack_730[1].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_;
        uStack_2ec = avStack_730[1].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_;
        local_308 = avStack_730[0].
                    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_;
        uStack_304 = avStack_730[0].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_;
        uStack_300 = avStack_730[0].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        uStack_2fc = avStack_730[0].
                     super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     ._M_impl.super__Vector_impl_data._M_finish._4_4_;
        local_318 = (_func_int **)local_740;
        _Stack_310._M_p = (pointer)auStack_738;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700 == &local_6f0) {
          local_2c8._8_8_ = local_6f0._8_8_;
        }
        else {
          local_2d8._M_p = (pointer)local_700;
        }
        local_2d0 = local_6f8;
        local_6f8 = 0;
        local_6f0._M_local_buf[0] = '\0';
        local_2b8 = local_6e0;
        pbStack_2b0 = pbStack_6d8;
        local_2a8 = local_6d0;
        local_6e0 = (pointer)0x0;
        pbStack_6d8 = (pointer)0x0;
        local_6d0 = (pointer)0x0;
        local_700 = &local_6f0;
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"here","");
        make_error_info<>((error_info *)local_620,&local_4b8,(source_location *)&local_318,
                          &local_4d8);
        err<toml::error_info>(&local_88,(error_info *)local_620);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
        failure<toml::error_info>::~failure(&local_88);
        error_info::~error_info((error_info *)local_620);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_318);
        _Var11._M_p = local_4b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) goto LAB_00372893;
        goto LAB_0037289b;
      }
      parse_utf8_codepoint<toml::type_config>
                ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)local_740,(region *)local_688);
      sVar5 = local_740[0];
      if (local_740[0] == (string)0x0) {
        err<toml::error_info_const&>(&local_1e8,(toml *)auStack_738,v);
        __return_storage_ptr__->is_ok_ = false;
        this = (EVP_PKEY_CTX *)&local_1e8;
        goto LAB_003724ef;
      }
      pvVar2 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                         *)local_740,(source_location)0x4e0028);
      ctx_00 = (EVP_PKEY_CTX *)(pvVar2->_M_dataplus)._M_p;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(&local_6c8,(char *)ctx_00,pvVar2->_M_string_length);
      goto LAB_003724ff;
    }
LAB_00371cd8:
    local_6c8.field_2._M_local_buf[0] = '\0';
    local_6c8._M_string_length = 0;
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    region::region((region *)local_688,loc);
    source_location::source_location((source_location *)local_740,(region *)local_688);
    region::~region((region *)local_688);
    local_620._0_8_ = local_620 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_620,"allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t","");
    if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_e == true) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                 ", \\e");
    }
    if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_x == true) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                 ", \\xhh");
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
               ", \\uhhhh, or \\Uhhhhhhhh");
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_578,"toml::parse_escape_sequence: unknown escape sequence.","");
    local_458._M_p = (pointer)&local_448;
    local_468 = avStack_730[1].
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    uStack_464 = avStack_730[1].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    uStack_460 = avStack_730[1].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    uStack_45c = avStack_730[1].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_478 = avStack_730[0].
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    uStack_474 = avStack_730[0].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    uStack_470 = avStack_730[1].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_;
    uStack_46c = avStack_730[1].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
    local_488 = avStack_730[0].
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_;
    uStack_484 = avStack_730[0].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_;
    uStack_480 = avStack_730[0].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    uStack_47c = avStack_730[0].
                 super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    local_498 = (_func_int **)local_740;
    _Stack_490._M_p = (pointer)auStack_738;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700 == &local_6f0) {
      local_448._8_8_ = local_6f0._8_8_;
    }
    else {
      local_458._M_p = (pointer)local_700;
    }
    local_450 = local_6f8;
    local_6f8 = 0;
    local_6f0._M_local_buf[0] = '\0';
    local_438 = local_6e0;
    pbStack_430 = pbStack_6d8;
    local_428 = local_6d0;
    local_6e0 = (pointer)0x0;
    pbStack_6d8 = (pointer)0x0;
    local_6d0 = (pointer)0x0;
    local_700 = &local_6f0;
    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_598,local_620._0_8_,
               (pointer)(local_620._0_8_ + CONCAT71(local_620._9_7_,local_620[8])));
    make_error_info<>((error_info *)local_688,&local_578,(source_location *)&local_498,&local_598);
    err<toml::error_info>(&local_190,(error_info *)local_688);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_190);
    failure<toml::error_info>::~failure(&local_190);
    error_info::~error_info((error_info *)local_688);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)&local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
      operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
    }
    source_location::~source_location((source_location *)local_740);
    goto LAB_003729ba;
  }
  if (*(char *)(lVar3 + uVar10) == '\n') {
    loc->line_number_ = loc->line_number_ + 1;
    sVar8 = 1;
  }
  else {
    sVar8 = loc->column_number_ + 1;
  }
  loc->column_number_ = sVar8;
  uVar10 = uVar10 + 1;
LAB_0037196e:
  loc->location_ = uVar10;
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  local_6c8._M_string_length = 0;
  local_6c8.field_2._M_local_buf[0] = '\0';
  bVar12 = uVar7 <= uVar10;
  uVar7 = uVar10;
  if (bVar12) goto LAB_00371a79;
  bVar6 = *(byte *)(lVar3 + uVar10);
  if (bVar6 < 0x66) {
    if (bVar6 == 0x22) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_6c8,'\"');
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar7 = loc->location_;
      uVar10 = uVar7 + 1;
      lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar3;
      if (uVar10 < uVar4) {
LAB_00372251:
        if (*(char *)(lVar3 + uVar7) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar8 = 1;
        }
        else {
          sVar8 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar8;
      }
      else {
        uVar10 = uVar7;
        if (uVar4 != uVar7) {
          sVar8 = loc->line_number_;
          sVar9 = loc->column_number_;
          do {
            if (*(char *)(lVar3 + uVar7) == '\n') {
              sVar8 = sVar8 + 1;
              loc->line_number_ = sVar8;
              sVar9 = 1;
            }
            else {
              sVar9 = sVar9 + 1;
            }
            loc->column_number_ = sVar9;
            uVar7 = uVar7 + 1;
            uVar10 = uVar4;
          } while (uVar4 != uVar7);
        }
      }
    }
    else if (bVar6 == 0x5c) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_6c8,'\\');
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar7 = loc->location_;
      uVar10 = uVar7 + 1;
      lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar3;
      if (uVar10 < uVar4) goto LAB_00372251;
      uVar10 = uVar7;
      if (uVar4 != uVar7) {
        sVar8 = loc->line_number_;
        sVar9 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar7) == '\n') {
            sVar8 = sVar8 + 1;
            loc->line_number_ = sVar8;
            sVar9 = 1;
          }
          else {
            sVar9 = sVar9 + 1;
          }
          loc->column_number_ = sVar9;
          uVar7 = uVar7 + 1;
          uVar10 = uVar4;
        } while (uVar4 != uVar7);
      }
    }
    else {
      if (bVar6 != 0x62) goto LAB_00372165;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_6c8,'\b');
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar7 = loc->location_;
      uVar10 = uVar7 + 1;
      lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar3;
      if (uVar10 < uVar4) goto LAB_00372251;
      uVar10 = uVar7;
      if (uVar4 != uVar7) {
        sVar8 = loc->line_number_;
        sVar9 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar7) == '\n') {
            sVar8 = sVar8 + 1;
            loc->line_number_ = sVar8;
            sVar9 = 1;
          }
          else {
            sVar9 = sVar9 + 1;
          }
          loc->column_number_ = sVar9;
          uVar7 = uVar7 + 1;
          uVar10 = uVar4;
        } while (uVar4 != uVar7);
      }
    }
    goto LAB_00372905;
  }
  if (bVar6 < 0x72) {
    if (bVar6 == 0x66) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_6c8,'\f');
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar7 = loc->location_;
      uVar10 = uVar7 + 1;
      lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar3;
      if (uVar10 < uVar4) goto LAB_00372251;
      uVar10 = uVar7;
      if (uVar4 != uVar7) {
        sVar8 = loc->line_number_;
        sVar9 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar7) == '\n') {
            sVar8 = sVar8 + 1;
            loc->line_number_ = sVar8;
            sVar9 = 1;
          }
          else {
            sVar9 = sVar9 + 1;
          }
          loc->column_number_ = sVar9;
          uVar7 = uVar7 + 1;
          uVar10 = uVar4;
        } while (uVar4 != uVar7);
      }
LAB_00372905:
      loc->location_ = uVar10;
      goto LAB_00372909;
    }
    if (bVar6 == 0x6e) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_6c8,'\n');
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar7 = loc->location_;
      uVar10 = uVar7 + 1;
      lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar3;
      if (uVar10 < uVar4) goto LAB_00372251;
      uVar10 = uVar7;
      if (uVar4 != uVar7) {
        sVar8 = loc->line_number_;
        sVar9 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar7) == '\n') {
            sVar8 = sVar8 + 1;
            loc->line_number_ = sVar8;
            sVar9 = 1;
          }
          else {
            sVar9 = sVar9 + 1;
          }
          loc->column_number_ = sVar9;
          uVar7 = uVar7 + 1;
          uVar10 = uVar4;
        } while (uVar4 != uVar7);
      }
      goto LAB_00372905;
    }
LAB_00372165:
    bVar12 = true;
    if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_e == false) goto LAB_00371a7f;
    if (bVar6 == 0x65) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_6c8,'\x1b');
      goto LAB_0037220f;
    }
    if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_x != false) goto LAB_00371a9a;
    goto LAB_00371bb9;
  }
  if (bVar6 == 0x72) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_6c8,'\r');
  }
  else {
    if (bVar6 != 0x74) goto LAB_00372165;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_6c8,'\t');
  }
LAB_0037220f:
  location::advance(loc,1);
LAB_00372909:
  local_740 = (undefined1  [8])(auStack_738 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_740,local_6c8._M_dataplus._M_p,
             local_6c8._M_dataplus._M_p + local_6c8._M_string_length);
  local_5b8 = &p_Stack_5a8;
  if (local_740 == (undefined1  [8])(auStack_738 + 8)) {
    uStack_5a0 = CONCAT44(avStack_730[0].
                          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          avStack_730[0].
                          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
         (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
LAB_00372994:
    p_Stack_5a8 = (_func_int *)
                  CONCAT44(avStack_730[0].
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           avStack_730[0].
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
    (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
         (size_type)p_Stack_5a8;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) = uStack_5a0;
  }
  else {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
         (pointer)((long)&__return_storage_ptr__->field_1 + 0x10);
    if (local_740 == (undefined1  [8])local_5b8) goto LAB_00372994;
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p = (pointer)local_740;
    (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
         CONCAT44(avStack_730[0].
                  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                  avStack_730[0].
                  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
  }
  p_Stack_5a8 = (_func_int *)
                CONCAT44(avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         avStack_730[0].
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
  (__return_storage_ptr__->field_1).succ_.value._M_string_length = (size_type)auStack_738;
  local_5b0 = 0;
  p_Stack_5a8 = (_func_int *)((ulong)p_Stack_5a8 & 0xffffffffffffff00);
LAB_003729ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,
                    CONCAT71(local_6c8.field_2._M_allocated_capacity._1_7_,
                             local_6c8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_escape_sequence(location& loc, const context<TC>& ctx)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    const auto& spec = ctx.toml_spec();

    assert( ! loc.eof());
    assert(loc.current() == '\\');
    loc.advance(); // consume the first backslash

    string_type retval;

    if     (loc.current() == '\\') { retval += char_type('\\'); loc.advance(); }
    else if(loc.current() == '"')  { retval += char_type('\"'); loc.advance(); }
    else if(loc.current() == 'b')  { retval += char_type('\b'); loc.advance(); }
    else if(loc.current() == 'f')  { retval += char_type('\f'); loc.advance(); }
    else if(loc.current() == 'n')  { retval += char_type('\n'); loc.advance(); }
    else if(loc.current() == 'r')  { retval += char_type('\r'); loc.advance(); }
    else if(loc.current() == 't')  { retval += char_type('\t'); loc.advance(); }
    else if(spec.v1_1_0_add_escape_sequence_e && loc.current() == 'e')
    {
        retval += char_type('\x1b');
        loc.advance();
    }
    else if(spec.v1_1_0_add_escape_sequence_x && loc.current() == 'x')
    {
        auto scanner = sequence(character('x'), repeat_exact(2, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\xhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'u')
    {
        auto scanner = sequence(character('u'), repeat_exact(4, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\uhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'U')
    {
        auto scanner = sequence(character('U'), repeat_exact(8, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\Uhhhhhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else
    {
        auto src = source_location(region(loc));
        std::string escape_seqs = "allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t";
        if(spec.v1_1_0_add_escape_sequence_e)
        {
            escape_seqs += ", \\e";
        }
        if(spec.v1_1_0_add_escape_sequence_x)
        {
            escape_seqs += ", \\xhh";
        }
        escape_seqs += ", \\uhhhh, or \\Uhhhhhhhh";

        return err(make_error_info("toml::parse_escape_sequence: "
               "unknown escape sequence.", std::move(src), escape_seqs));
    }
    return ok(retval);
}